

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O2

void __thiscall BufferReader::BufferReader(BufferReader *this,int size)

{
  *(undefined ***)&this->field_0x28 = &PTR___cxa_pure_virtual_0011ad78;
  Buffer::Buffer(&this->super_Buffer,size);
  (this->super_Buffer)._vptr_Buffer = (_func_int **)0x119e68;
  *(undefined8 *)&this->field_0x28 = 0x119ea0;
  this->read_end = (this->super_Buffer).buf_start;
  return;
}

Assistant:

BufferReader::BufferReader(int size) : Buffer(size) {
  read_end = buf_start;
}